

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

uint32_t helper_mvclu(CPUS390XState_conflict *env,uint32_t r1,uint64_t a2,uint32_t r3)

{
  ulong uVar1;
  uint32_t uVar2;
  uintptr_t unaff_retaddr;
  uint64_t dest;
  ulong local_60;
  uint64_t local_58;
  long local_50;
  uint64_t src;
  uint64_t destlen;
  uint64_t srclen;
  
  local_50 = (long)(int)(r1 + 1);
  uVar1 = (env->psw).mask;
  destlen = env->regs[local_50] & 0x7fffffff;
  if ((uVar1 >> 0x20 & 1) != 0) {
    destlen = env->regs[local_50];
  }
  local_58 = a2;
  dest = get_address(env,r1);
  srclen = env->regs[(int)(r3 + 1)] & 0x7fffffff;
  if ((uVar1 >> 0x20 & 1) != 0) {
    srclen = env->regs[(int)(r3 + 1)];
  }
  local_60 = (ulong)r3;
  src = get_address(env,r3);
  uVar2 = do_mvcl(env,&dest,&destlen,&src,&srclen,(uint16_t)local_58,2,unaff_retaddr);
  set_length(env,(int)local_50,destlen);
  set_length(env,r3 + 1,srclen);
  set_address(env,r1,dest);
  set_address(env,(int)local_60,src);
  return uVar2;
}

Assistant:

uint32_t HELPER(mvclu)(CPUS390XState *env, uint32_t r1, uint64_t a2,
                       uint32_t r3)
{
    uintptr_t ra = GETPC();
    uint64_t destlen = get_length(env, r1 + 1);
    uint64_t dest = get_address(env, r1);
    uint64_t srclen = get_length(env, r3 + 1);
    uint64_t src = get_address(env, r3);
    uint16_t pad = a2;
    uint32_t cc;

    cc = do_mvcl(env, &dest, &destlen, &src, &srclen, pad, 2, ra);

    set_length(env, r1 + 1, destlen);
    set_length(env, r3 + 1, srclen);
    set_address(env, r1, dest);
    set_address(env, r3, src);

    return cc;
}